

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void __thiscall File::output_binary(File *this,ofstream *out)

{
  variant_alternative_t<2UL,_variant<basic_string<char>,_int,_double>_> vVar1;
  Type TVar2;
  variant_alternative_t<1UL,_variant<basic_string<char>,_int,_double>_> vVar3;
  pointer pCVar4;
  pointer pcVar5;
  pointer pFVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [15];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  uint uVar22;
  variant_alternative_t<0UL,_variant<basic_string<char>,_int,_double>_> *pvVar23;
  variant_alternative_t<1UL,_variant<basic_string<char>,_int,_double>_> *pvVar24;
  variant_alternative_t<2UL,_variant<basic_string<char>,_int,_double>_> *pvVar25;
  char *pcVar26;
  char *pcVar27;
  int i;
  long lVar28;
  Function *fun;
  pointer pFVar29;
  pointer pCVar30;
  char acVar31 [8];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  u2 v_1;
  anon_class_16_2_09cc686c writeNBytes;
  u2 functions_count;
  anon_class_8_1_5a786fbc to_binary;
  char bytes [8];
  undefined2 local_72;
  anon_class_16_2_09cc686c local_70;
  undefined2 local_5a;
  anon_class_8_1_5a786fbc local_58 [2];
  anon_class_16_2_09cc686c local_48;
  ushort local_38 [4];
  undefined1 auVar34 [16];
  ulong uVar37;
  
  local_70.bytes = (char (*) [8])local_38;
  local_70.out = out;
  std::ostream::write((char *)out,0x11b54d);
  std::ostream::write((char *)out,0x11bc8a);
  uVar22 = ((uint)(*(int *)&(this->constants).
                            super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                  *(int *)&(this->constants).
                           super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 4) * -0x5555;
  auVar32 = psllw(ZEXT416(uVar22),8);
  local_38[0] = auVar32._0_2_ | (ushort)uVar22 >> 8;
  std::ostream::write((char *)out,(long)local_38);
  pCVar30 = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pCVar4 = (this->constants).super__Vector_base<vm::Constant,_std::allocator<vm::Constant>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pCVar30 != pCVar4) {
    do {
      TVar2 = pCVar30->type;
      if (TVar2 == DOUBLE) {
        std::ostream::write((char *)out,0x11b554);
        pvVar25 = std::get<2ul,std::__cxx11::string,int,double>(&pCVar30->value);
        vVar1 = *pvVar25;
        auVar12._8_6_ = 0;
        auVar12._0_8_ = vVar1;
        auVar12[0xe] = (char)((ulong)vVar1 >> 0x38);
        auVar17._8_4_ = 0;
        auVar17._0_8_ = vVar1;
        auVar17[0xc] = (char)((ulong)vVar1 >> 0x30);
        auVar17._13_2_ = auVar12._13_2_;
        auVar18._8_4_ = 0;
        auVar18._0_8_ = vVar1;
        auVar18._12_3_ = auVar17._12_3_;
        auVar19._8_2_ = 0;
        auVar19._0_8_ = vVar1;
        auVar19[10] = (char)((ulong)vVar1 >> 0x28);
        auVar19._11_4_ = auVar18._11_4_;
        auVar20._8_2_ = 0;
        auVar20._0_8_ = vVar1;
        auVar20._10_5_ = auVar19._10_5_;
        auVar21[8] = (char)((ulong)vVar1 >> 0x20);
        auVar21._0_8_ = vVar1;
        auVar21._9_6_ = auVar20._9_6_;
        uVar37 = CONCAT17(0,auVar21._8_7_);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = uVar37;
        auVar15._1_9_ = SUB169(auVar16 << 0x40,7);
        auVar15[0] = (char)((ulong)vVar1 >> 0x18);
        auVar15._10_6_ = 0;
        auVar11._1_11_ = SUB1611(auVar15 << 0x30,5);
        auVar11[0] = (char)((ulong)vVar1 >> 0x10);
        auVar32._12_4_ = 0;
        auVar32._0_12_ = auVar11;
        auVar35._3_13_ = SUB1613(auVar32 << 0x20,3);
        auVar35[2] = (char)((ulong)vVar1 >> 8);
        auVar35[0] = SUB81(vVar1,0);
        auVar35[1] = 0;
        auVar36._8_4_ = auVar35._0_4_;
        auVar36._0_8_ = uVar37;
        auVar36._12_4_ = auVar11._0_4_;
        auVar32 = pshuflw(auVar36,auVar36,0x1b);
        auVar32 = pshufhw(auVar32,auVar32,0x1b);
        sVar7 = auVar32._0_2_;
        sVar8 = auVar32._2_2_;
        acVar31[1] = (0 < sVar8) * (sVar8 < 0x100) * auVar32[2] - (0xff < sVar8);
        acVar31[0] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[0] - (0xff < sVar7);
        sVar7 = auVar32._4_2_;
        acVar31[2] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[4] - (0xff < sVar7);
        sVar7 = auVar32._6_2_;
        acVar31[3] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[6] - (0xff < sVar7);
        sVar7 = auVar32._8_2_;
        acVar31[4] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[8] - (0xff < sVar7);
        sVar7 = auVar32._10_2_;
        acVar31[5] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[10] - (0xff < sVar7);
        sVar7 = auVar32._12_2_;
        acVar31[6] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[0xc] - (0xff < sVar7);
        sVar7 = auVar32._14_2_;
        acVar31[7] = (0 < sVar7) * (sVar7 < 0x100) * auVar32[0xe] - (0xff < sVar7);
        *local_70.bytes = acVar31;
LAB_0011022e:
        std::ostream::write((char *)local_70.out,(long)local_70.bytes);
      }
      else {
        if (TVar2 == INT) {
          std::ostream::write((char *)out,0x11b552);
          pvVar24 = std::get<1ul,std::__cxx11::string,int,double>(&pCVar30->value);
          vVar3 = *pvVar24;
          auVar14._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
          auVar14[0] = (char)((uint)vVar3 >> 0x18);
          auVar14._10_6_ = 0;
          auVar34._5_11_ = SUB1611(auVar14 << 0x30,5);
          auVar34[4] = (char)((uint)vVar3 >> 0x10);
          auVar34._0_4_ = vVar3;
          auVar13._12_4_ = 0;
          auVar13._0_12_ = auVar34._4_12_;
          auVar33._3_13_ = SUB1613(auVar13 << 0x20,3);
          auVar33[2] = (char)((uint)vVar3 >> 8);
          auVar33[0] = (byte)vVar3;
          auVar33[1] = 0;
          auVar32 = pshuflw(auVar33,auVar33,0x1b);
          sVar7 = auVar32._0_2_;
          sVar8 = auVar32._2_2_;
          sVar9 = auVar32._4_2_;
          sVar10 = auVar32._6_2_;
          *(uint *)*local_70.bytes =
               CONCAT13((0 < sVar10) * (sVar10 < 0x100) * auVar32[6] - (0xff < sVar10),
                        CONCAT12((0 < sVar9) * (sVar9 < 0x100) * auVar32[4] - (0xff < sVar9),
                                 CONCAT11((0 < sVar8) * (sVar8 < 0x100) * auVar32[2] -
                                          (0xff < sVar8),
                                          (0 < sVar7) * (sVar7 < 0x100) * auVar32[0] -
                                          (0xff < sVar7))));
          goto LAB_0011022e;
        }
        if (TVar2 != STRING) {
          __assert_fail("(\"unexpected error\", false)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/BUAA-SE-Compiling[P]c0-vm-cpp/src/file.cpp"
                        ,0x65,"void File::output_binary(std::ofstream &)");
        }
        std::ostream::write((char *)out,0x11bc8f);
        pvVar23 = std::get<0ul,std::__cxx11::string,int,double>(&pCVar30->value);
        pcVar5 = (pvVar23->_M_dataplus)._M_p;
        local_58[0].writeNBytes = &local_48;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_58,pcVar5,pcVar5 + pvVar23->_M_string_length);
        auVar32 = psllw(ZEXT416((uint)local_58[1].writeNBytes),8);
        *(ushort *)*local_70.bytes =
             auVar32._0_2_ | (ushort)((ulong)local_58[1].writeNBytes >> 8) & 0xff;
        std::ostream::write((char *)local_70.out,(long)local_70.bytes);
        std::ostream::write((char *)out,(long)local_58[0].writeNBytes);
        if (local_58[0].writeNBytes != &local_48) {
          operator_delete(local_58[0].writeNBytes,(ulong)(*local_48.bytes + 1));
        }
      }
      pCVar30 = pCVar30 + 1;
    } while (pCVar30 != pCVar4);
  }
  local_58[0].writeNBytes = &local_70;
  output_binary::anon_class_8_1_5a786fbc::operator()(local_58,&this->start);
  pcVar26 = (char *)((long)&local_5a + 1);
  local_5a = (undefined2)
             ((uint)(*(int *)&(this->functions).
                              super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->functions).
                             super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
                             .super__Vector_impl_data._M_start) >> 5);
  lVar28 = 0;
  do {
    (*local_70.bytes)[lVar28] = *pcVar26;
    lVar28 = lVar28 + 1;
    pcVar26 = pcVar26 + -1;
  } while (lVar28 != 2);
  std::ostream::write((char *)local_70.out,(long)local_70.bytes);
  pFVar29 = (this->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pFVar6 = (this->functions).super__Vector_base<vm::Function,_std::allocator<vm::Function>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pFVar29 != pFVar6) {
    pcVar26 = (char *)((long)&local_72 + 1);
    do {
      local_72 = pFVar29->nameIndex;
      lVar28 = 0;
      pcVar27 = pcVar26;
      do {
        (*local_70.bytes)[lVar28] = *pcVar27;
        lVar28 = lVar28 + 1;
        pcVar27 = pcVar27 + -1;
      } while (lVar28 != 2);
      std::ostream::write((char *)local_70.out,(long)local_70.bytes);
      local_72 = pFVar29->paramSize;
      lVar28 = 0;
      pcVar27 = pcVar26;
      do {
        (*local_70.bytes)[lVar28] = *pcVar27;
        lVar28 = lVar28 + 1;
        pcVar27 = pcVar27 + -1;
      } while (lVar28 != 2);
      std::ostream::write((char *)local_70.out,(long)local_70.bytes);
      local_72 = pFVar29->level;
      lVar28 = 0;
      pcVar27 = pcVar26;
      do {
        (*local_70.bytes)[lVar28] = *pcVar27;
        lVar28 = lVar28 + 1;
        pcVar27 = pcVar27 + -1;
      } while (lVar28 != 2);
      std::ostream::write((char *)local_70.out,(long)local_70.bytes);
      output_binary::anon_class_8_1_5a786fbc::operator()(local_58,&pFVar29->instructions);
      pFVar29 = pFVar29 + 1;
    } while (pFVar29 != pFVar6);
  }
  return;
}

Assistant:

void File::output_binary(std::ofstream& out) {

    char bytes[8];
    const auto writeNBytes = [&](void* addr, int count) {
        assert(0 < count && count <= 8);
        char* p = reinterpret_cast<char*>(addr) + (count-1);
        for (int i = 0; i < count; ++i) {
            bytes[i] = *p--;
        }
        out.write(bytes, count);
    };

    // magic
    out.write("\x43\x30\x3A\x29", 4);
    // version
    out.write("\x00\x00\x00\x01", 4);
    // constants_count
    vm::u2 constants_count = constants.size();
    writeNBytes(&constants_count, sizeof constants_count);
    // constants
    for (auto& constant : constants) {
        switch (constant.type)
        {
        case vm::Constant::Type::STRING: {
            out.write("\x00", 1);
            std::string v = std::get<vm::str_t>(constant.value);
            vm::u2 len = v.length();
            writeNBytes(&len, sizeof len);
            out.write(v.c_str(), len);
        } break;
        case vm::Constant::Type::INT: {
            out.write("\x01", 1);
            vm::int_t v = std::get<vm::int_t>(constant.value);
            writeNBytes(&v, sizeof v);
        } break;
        case vm::Constant::Type::DOUBLE: {
            out.write("\x02", 1);
            vm::double_t v = std::get<vm::double_t>(constant.value);
            writeNBytes(&v, sizeof v);
        } break;
        default: assert(("unexpected error", false)); break;
        }
    }

    auto to_binary = [&](const std::vector<vm::Instruction>& v) {
        vm::u2 instructions_count = v.size();
        writeNBytes(&instructions_count, sizeof instructions_count);
        for (auto& ins : v) {
            vm::u1 op = static_cast<vm::u1>(ins.op); 
            writeNBytes(&op, sizeof op);
            if (auto it = vm::paramSizeOfOpCode.find(ins.op); it != vm::paramSizeOfOpCode.end()) {
                auto paramSizes = it->second;
                switch (paramSizes[0]) {
                #define CASE(n) case n: { vm::u##n x = ins.x; writeNBytes(&x, n); }
                CASE(1); break; 
                CASE(2); break;
                CASE(4); break;
                #undef CASE
                default: assert(("unexpected error", false));
                }
                if (paramSizes.size() == 2) {
                    switch (paramSizes[1]) {
                    #define CASE(n) case n: { vm::u##n y = ins.y; writeNBytes(&y, n); }
                    CASE(1); break; 
                    CASE(2); break;
                    CASE(4); break;
                    #undef CASE
                    default: assert(("unexpected error", false));
                    }
                }
            }
        }
    };

    // start
    to_binary(start);
    // functions_count
    vm::u2 functions_count = functions.size();
    writeNBytes(&functions_count, sizeof functions_count);
    // functions
    for (auto& fun : functions) {
        vm::u2 v;
        v = fun.nameIndex; writeNBytes(&v, sizeof v);
        v = fun.paramSize; writeNBytes(&v, sizeof v);
        v = fun.level;     writeNBytes(&v, sizeof v);
        to_binary(fun.instructions);
    }
}